

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,unsigned_char>
          (BaseAppender *this,Vector *col,float input)

{
  uchar uVar1;
  uchar *puVar2;
  idx_t iVar3;
  long in_RDI;
  float unaff_retaddr;
  
  uVar1 = Cast::Operation<float,unsigned_char>(unaff_retaddr);
  puVar2 = FlatVector::GetData<unsigned_char>((Vector *)0x946c57);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}